

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pad.cpp
# Opt level: O2

void duckdb::PadFunction<duckdb::RightPadOperator>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  idx_t count;
  unsigned_long *puVar1;
  anon_union_16_2_67f50693_for_value *paVar2;
  reference this;
  reference this_00;
  reference this_01;
  idx_t iVar3;
  ValidityMask *this_02;
  idx_t iVar4;
  idx_t iVar5;
  ValidityMask *in_R9;
  idx_t iVar6;
  data_ptr_t pdVar7;
  anon_class_16_2_52ce5e5c fun;
  anon_class_16_2_52ce5e5c fun_00;
  anon_class_16_2_52ce5e5c fun_01;
  string_t sVar8;
  anon_struct_16_3_d7536bce_for_pointer aVar9;
  string_t a;
  vector<char,_true> buffer;
  UnifiedVectorFormat local_108;
  UnifiedVectorFormat bdata;
  UnifiedVectorFormat adata;
  
  this = vector<duckdb::Vector,_true>::get<true>(&args->data,0);
  this_00 = vector<duckdb::Vector,_true>::get<true>(&args->data,1);
  this_01 = vector<duckdb::Vector,_true>::get<true>(&args->data,2);
  buffer.super_vector<char,_std::allocator<char>_>.super__Vector_base<char,_std::allocator<char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  buffer.super_vector<char,_std::allocator<char>_>.super__Vector_base<char,_std::allocator<char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  buffer.super_vector<char,_std::allocator<char>_>.super__Vector_base<char,_std::allocator<char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  count = args->count;
  if (((this->vector_type == CONSTANT_VECTOR) && (this_00->vector_type == CONSTANT_VECTOR)) &&
     (this_01->vector_type == CONSTANT_VECTOR)) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    puVar1 = (this->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((((puVar1 == (unsigned_long *)0x0) || ((*puVar1 & 1) != 0)) &&
        ((puVar1 = (this_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
         puVar1 == (unsigned_long *)0x0 || ((*puVar1 & 1) != 0)))) &&
       ((puVar1 = (this_01->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
        puVar1 == (unsigned_long *)0x0 || ((*puVar1 & 1) != 0)))) {
      paVar2 = (anon_union_16_2_67f50693_for_value *)result->data;
      fun_01.buffer = &buffer;
      fun_01.result = result;
      aVar9 = (anon_struct_16_3_d7536bce_for_pointer)
              TernaryLambdaWrapper::
              Operation<duckdb::PadFunction<duckdb::RightPadOperator>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,int,duckdb::string_t)_1_,duckdb::string_t,int,duckdb::string_t,duckdb::string_t>
                        (fun_01,(string_t)
                                ((anon_union_16_2_67f50693_for_value *)this->data)->pointer,
                         *(int *)this_00->data,
                         (string_t)((anon_union_16_2_67f50693_for_value *)this_01->data)->pointer,
                         (ValidityMask *)
                         &((anon_union_16_2_67f50693_for_value *)this_01->data)->pointer,
                         (idx_t)result);
      paVar2->pointer = aVar9;
    }
    else {
      ConstantVector::SetNull(result,true);
    }
  }
  else {
    Vector::SetVectorType(result,FLAT_VECTOR);
    UnifiedVectorFormat::UnifiedVectorFormat(&adata);
    UnifiedVectorFormat::UnifiedVectorFormat(&bdata);
    UnifiedVectorFormat::UnifiedVectorFormat(&local_108);
    Vector::ToUnifiedFormat(this,count,&adata);
    Vector::ToUnifiedFormat(this_00,count,&bdata);
    Vector::ToUnifiedFormat(this_01,count,&local_108);
    pdVar7 = result->data;
    FlatVector::VerifyFlatVector(result);
    if (((adata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) &&
        (bdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
         (unsigned_long *)0x0)) &&
       (local_108.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0)) {
      pdVar7 = pdVar7 + 8;
      for (iVar6 = 0; count != iVar6; iVar6 = iVar6 + 1) {
        iVar3 = iVar6;
        if ((adata.sel)->sel_vector != (sel_t *)0x0) {
          iVar3 = (idx_t)(adata.sel)->sel_vector[iVar6];
        }
        iVar4 = iVar6;
        if ((bdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar4 = (idx_t)(bdata.sel)->sel_vector[iVar6];
        }
        iVar5 = iVar6;
        if ((local_108.sel)->sel_vector != (sel_t *)0x0) {
          iVar5 = (idx_t)(local_108.sel)->sel_vector[iVar6];
        }
        fun.buffer = &buffer;
        fun.result = result;
        a.value.pointer.ptr = (char *)*(undefined8 *)(adata.data + iVar3 * 0x10 + 8);
        a.value._0_8_ = *(undefined8 *)(adata.data + iVar3 * 0x10);
        sVar8 = TernaryLambdaWrapper::
                Operation<duckdb::PadFunction<duckdb::RightPadOperator>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,int,duckdb::string_t)_1_,duckdb::string_t,int,duckdb::string_t,duckdb::string_t>
                          (fun,a,*(int *)(bdata.data + iVar4 * 4),
                           (string_t)
                           ((anon_union_16_2_67f50693_for_value *)(local_108.data + iVar5 * 0x10))->
                           pointer,in_R9,(idx_t)result);
        *(long *)(pdVar7 + -8) = sVar8.value._0_8_;
        *(long *)pdVar7 = sVar8.value._8_8_;
        pdVar7 = pdVar7 + 0x10;
      }
    }
    else {
      this_02 = &result->validity;
      pdVar7 = pdVar7 + 8;
      for (iVar6 = 0; count != iVar6; iVar6 = iVar6 + 1) {
        iVar3 = iVar6;
        if ((adata.sel)->sel_vector != (sel_t *)0x0) {
          iVar3 = (idx_t)(adata.sel)->sel_vector[iVar6];
        }
        iVar4 = iVar6;
        if ((bdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar4 = (idx_t)(bdata.sel)->sel_vector[iVar6];
        }
        iVar5 = iVar6;
        if ((local_108.sel)->sel_vector != (sel_t *)0x0) {
          iVar5 = (idx_t)(local_108.sel)->sel_vector[iVar6];
        }
        if (((adata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) ||
            ((adata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar3 >> 6] >>
              (iVar3 & 0x3f) & 1) != 0)) &&
           (((bdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0 ||
             ((bdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar4 >> 6]
               >> (iVar4 & 0x3f) & 1) != 0)) &&
            ((local_108.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0 ||
             ((local_108.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
               [iVar5 >> 6] >> (iVar5 & 0x3f) & 1) != 0)))))) {
          fun_00.buffer = &buffer;
          fun_00.result = result;
          sVar8.value.pointer.ptr = (char *)*(undefined8 *)(adata.data + iVar3 * 0x10 + 8);
          sVar8.value._0_8_ = *(undefined8 *)(adata.data + iVar3 * 0x10);
          sVar8 = TernaryLambdaWrapper::
                  Operation<duckdb::PadFunction<duckdb::RightPadOperator>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,int,duckdb::string_t)_1_,duckdb::string_t,int,duckdb::string_t,duckdb::string_t>
                            (fun_00,sVar8,*(int *)(bdata.data + iVar4 * 4),
                             (string_t)
                             ((anon_union_16_2_67f50693_for_value *)(local_108.data + iVar5 * 0x10))
                             ->pointer,in_R9,(idx_t)result);
          *(long *)(pdVar7 + -8) = sVar8.value._0_8_;
          *(long *)pdVar7 = sVar8.value._8_8_;
        }
        else {
          TemplatedValidityMask<unsigned_long>::SetInvalid
                    (&this_02->super_TemplatedValidityMask<unsigned_long>,iVar6);
        }
        pdVar7 = pdVar7 + 0x10;
      }
    }
    UnifiedVectorFormat::~UnifiedVectorFormat(&local_108);
    UnifiedVectorFormat::~UnifiedVectorFormat(&bdata);
    UnifiedVectorFormat::~UnifiedVectorFormat(&adata);
  }
  ::std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            ((_Vector_base<char,_std::allocator<char>_> *)&buffer);
  return;
}

Assistant:

static void PadFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	auto &str_vector = args.data[0];
	auto &len_vector = args.data[1];
	auto &pad_vector = args.data[2];

	vector<char> buffer;
	TernaryExecutor::Execute<string_t, int32_t, string_t, string_t>(
	    str_vector, len_vector, pad_vector, result, args.size(), [&](string_t str, int32_t len, string_t pad) {
		    len = MaxValue<int32_t>(len, 0);
		    return StringVector::AddString(result, OP::Operation(str, len, pad, buffer));
	    });
}